

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O3

Result_t * __thiscall
Kumu::Result_t::operator()(Result_t *__return_storage_ptr__,Result_t *this,int *line,char *filename)

{
  char *pcVar1;
  char buf [2048];
  char acStack_828 [2056];
  
  if (filename != (char *)0x0) {
    snprintf(acStack_828,0x7ff,"%s, line %d",filename,(ulong)(uint)*line);
    Result_t(__return_storage_ptr__,this);
    pcVar1 = (char *)(__return_storage_ptr__->message)._M_string_length;
    strlen(acStack_828);
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->message,0,pcVar1,(ulong)acStack_828);
    return __return_storage_ptr__;
  }
  __assert_fail("filename",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0xca,
                "const Kumu::Result_t Kumu::Result_t::operator()(const int &, const char *) const");
}

Assistant:

const Kumu::Result_t
Kumu::Result_t::operator()(const int& line, const char* filename) const
{
  assert(filename);
  char buf[MESSAGE_BUF_MAX];
  snprintf(buf, MESSAGE_BUF_MAX-1, "%s, line %d", filename, line);

  Result_t result = *this;
  result.message = buf;
  return result;
}